

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_connection_reconfigure(PacketProtocolLayer *ppl,Conf *conf)

{
  Interactor *pIVar1;
  ssh1_connection_state *s;
  Conf *conf_local;
  PacketProtocolLayer *ppl_local;
  
  conf_free((Conf *)ppl[-3].interactor);
  pIVar1 = (Interactor *)conf_copy(conf);
  ppl[-3].interactor = pIVar1;
  if (((ulong)ppl[-1].bpp & 1) != 0) {
    portfwdmgr_config((PortFwdManager *)ppl[-1].vt,(Conf *)ppl[-3].interactor);
  }
  return;
}

Assistant:

static void ssh1_connection_reconfigure(PacketProtocolLayer *ppl, Conf *conf)
{
    struct ssh1_connection_state *s =
        container_of(ppl, struct ssh1_connection_state, ppl);

    conf_free(s->conf);
    s->conf = conf_copy(conf);

    if (s->portfwdmgr_configured)
        portfwdmgr_config(s->portfwdmgr, s->conf);
}